

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_packet.cpp
# Opt level: O0

MPP_RET mpp_packet_add_segment_info(MppPacket packet,RK_S32 type,RK_S32 offset,RK_S32 len)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint local_44;
  void *pvStack_40;
  RK_U32 i;
  MppPktSeg *seg_buf;
  RK_U32 segment_nb;
  RK_U32 old_buf_cnt;
  MppPacketImpl *p;
  RK_S32 len_local;
  RK_S32 offset_local;
  RK_S32 type_local;
  MppPacket packet_local;
  
  uVar1 = *(uint *)((long)packet + 0x58);
  pvStack_40 = *(void **)((long)packet + 0x128);
  if (uVar1 < *(uint *)((long)packet + 0x5c)) {
    if (pvStack_40 == (void *)0x0) {
      pvStack_40 = (void *)((long)packet + 0x60);
      *(void **)((long)packet + 0x128) = pvStack_40;
    }
  }
  else {
    uVar2 = *(uint *)((long)packet + 0x5c) << 1;
    if (*(long *)((long)packet + 0x120) == 0) {
      pvStack_40 = mpp_osal_calloc("mpp_packet_add_segment_info",(ulong)uVar2 * 0x18);
      if (pvStack_40 != (void *)0x0) {
        memcpy(pvStack_40,(void *)((long)packet + 0x60),0xc0);
      }
    }
    else {
      pvStack_40 = mpp_osal_realloc("mpp_packet_add_segment_info",*(void **)((long)packet + 0x120),
                                    (ulong)uVar2 * 0x18);
    }
    if (pvStack_40 == (void *)0x0) {
      return MPP_NOK;
    }
    for (local_44 = 0; local_44 < uVar1 - 1; local_44 = local_44 + 1) {
      *(void **)((long)pvStack_40 + (ulong)local_44 * 0x18 + 0x10) =
           (void *)((long)pvStack_40 + (ulong)(local_44 + 1) * 0x18);
    }
    *(void **)((long)packet + 0x120) = pvStack_40;
    *(void **)((long)packet + 0x128) = pvStack_40;
    *(uint *)((long)packet + 0x5c) = uVar2;
  }
  if ((pvStack_40 == (void *)0x0) &&
     (_mpp_log_l(2,"mpp_packet","Assertion %s failed at %s:%d\n",(char *)0x0,"seg_buf",
                 "mpp_packet_add_segment_info",0x21f), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  puVar3 = (uint *)((long)pvStack_40 + (ulong)uVar1 * 0x18);
  *puVar3 = uVar1;
  puVar3[1] = type;
  puVar3[2] = offset;
  puVar3[3] = len;
  puVar3[4] = 0;
  puVar3[5] = 0;
  if (uVar1 != 0) {
    *(uint **)(puVar3 + -2) = puVar3;
  }
  *(int *)((long)packet + 0x58) = *(int *)((long)packet + 0x58) + 1;
  if ((*(uint *)((long)packet + 0x5c) < *(uint *)((long)packet + 0x58)) &&
     (_mpp_log_l(2,"mpp_packet","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "p->segment_nb <= p->segment_buf_cnt","mpp_packet_add_segment_info",0x22b),
     (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_packet_add_segment_info(MppPacket packet, RK_S32 type, RK_S32 offset, RK_S32 len)
{
    MppPacketImpl *p = (MppPacketImpl *)packet;
    RK_U32 old_buf_cnt = p->segment_buf_cnt;
    RK_U32 segment_nb  = p->segment_nb;
    MppPktSeg *seg_buf = p->segments;

    if (segment_nb >= old_buf_cnt) {
        RK_U32 i;

        /* realloc segment info buffer. default 8 segments */
        old_buf_cnt *= 2;

        if (NULL == p->segments_ext) {
            seg_buf = mpp_calloc(MppPktSeg, old_buf_cnt);
            if (seg_buf)
                memcpy(seg_buf, p->segments_def, sizeof(p->segments_def));
        } else {
            seg_buf = mpp_realloc(p->segments_ext, MppPktSeg, old_buf_cnt);
        }

        if (NULL == seg_buf)
            return MPP_NOK;

        for (i = 0; i < segment_nb - 1; i++)
            seg_buf[i].next = &seg_buf[i + 1];

        p->segments_ext = seg_buf;
        p->segments = seg_buf;
        p->segment_buf_cnt = old_buf_cnt;
    } else {
        if (NULL == seg_buf) {
            seg_buf = p->segments_def;
            p->segments = seg_buf;
        }
    }

    mpp_assert(seg_buf);
    seg_buf += segment_nb;
    seg_buf->index  = segment_nb;
    seg_buf->type   = type;
    seg_buf->offset = offset;
    seg_buf->len    = len;
    seg_buf->next   = NULL;

    if (segment_nb)
        seg_buf[-1].next = seg_buf;

    p->segment_nb++;
    mpp_assert(p->segment_nb <= p->segment_buf_cnt);

    return MPP_OK;
}